

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall flatbuffers::cpp::CppGenerator::GenFlatbuffersVersionCheck(CppGenerator *this)

{
  allocator<char> local_1b1;
  string local_1b0;
  string local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  CppGenerator *local_10;
  CppGenerator *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "// Ensure the included flatbuffers.h is the same version as when this file was",
             &local_31);
  CodeWriter::operator+=(&this->code_,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"// generated, otherwise it may not be compatible.",&local_69);
  CodeWriter::operator+=(&this->code_,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::to_string(&local_d0,0x19);
  std::operator+(&local_b0,"static_assert(FLATBUFFERS_VERSION_MAJOR == ",&local_d0);
  std::operator+(&local_90,&local_b0," &&");
  CodeWriter::operator+=(&this->code_,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::to_string(&local_130,2);
  std::operator+(&local_110,"              FLATBUFFERS_VERSION_MINOR == ",&local_130);
  std::operator+(&local_f0,&local_110," &&");
  CodeWriter::operator+=(&this->code_,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::to_string(&local_190,10);
  std::operator+(&local_170,"              FLATBUFFERS_VERSION_REVISION == ",&local_190);
  std::operator+(&local_150,&local_170,",");
  CodeWriter::operator+=(&this->code_,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1b0,"             \"Non-compatible flatbuffers version included\");",
             &local_1b1);
  CodeWriter::operator+=(&this->code_,&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  return;
}

Assistant:

void GenFlatbuffersVersionCheck() {
    code_ +=
        "// Ensure the included flatbuffers.h is the same version as when this "
        "file was";
    code_ += "// generated, otherwise it may not be compatible.";
    code_ += "static_assert(FLATBUFFERS_VERSION_MAJOR == " +
             std::to_string(FLATBUFFERS_VERSION_MAJOR) + " &&";
    code_ += "              FLATBUFFERS_VERSION_MINOR == " +
             std::to_string(FLATBUFFERS_VERSION_MINOR) + " &&";
    code_ += "              FLATBUFFERS_VERSION_REVISION == " +
             std::to_string(FLATBUFFERS_VERSION_REVISION) + ",";
    code_ += "             \"Non-compatible flatbuffers version included\");";
  }